

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> * __thiscall
wallet::CWallet::GetWalletDescriptors
          (vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>
           *__return_storage_ptr__,CWallet *this,CScript *script)

{
  DescriptorScriptPubKeyMan *this_00;
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock65;
  unique_lock<std::recursive_mutex> local_168;
  WalletDescriptor local_158;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                       *)&local_68,this,script);
  for (p_Var1 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &local_68._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var1)) {
    if (*(long *)(p_Var1 + 1) != 0) {
      this_00 = (DescriptorScriptPubKeyMan *)
                __dynamic_cast(*(long *)(p_Var1 + 1),&ScriptPubKeyMan::typeinfo,
                               &DescriptorScriptPubKeyMan::typeinfo,0);
      if (this_00 != (DescriptorScriptPubKeyMan *)0x0) {
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_168,
                   &this_00->cs_desc_man,"desc_spk_man->cs_desc_man",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                   ,0xe1a,false);
        DescriptorScriptPubKeyMan::GetWalletDescriptor(&local_158,this_00);
        std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::
        emplace_back<wallet::WalletDescriptor>(__return_storage_ptr__,&local_158);
        WalletDescriptor::~WalletDescriptor(&local_158);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_168);
      }
    }
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<WalletDescriptor> CWallet::GetWalletDescriptors(const CScript& script) const
{
    std::vector<WalletDescriptor> descs;
    for (const auto spk_man: GetScriptPubKeyMans(script)) {
        if (const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man)) {
            LOCK(desc_spk_man->cs_desc_man);
            descs.push_back(desc_spk_man->GetWalletDescriptor());
        }
    }
    return descs;
}